

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O3

void pp_tree_avl_rotate_right(PTreeAVLNode *node,PTreeBaseNode **root)

{
  int iVar1;
  PTreeBaseNode_ *pPVar2;
  PTreeAVLNode_ *pPVar3;
  PTreeAVLNode_ *pPVar4;
  
  pPVar2 = (node->base).right;
  pPVar4 = node->parent;
  (pPVar4->base).left = pPVar2;
  if (pPVar2 != (PTreeBaseNode_ *)0x0) {
    pPVar2[1].left = &pPVar4->base;
    pPVar4 = node->parent;
  }
  (node->base).right = &pPVar4->base;
  node->parent = pPVar4->parent;
  pPVar4->parent = node;
  pPVar3 = node->parent;
  if (pPVar3 != (PTreeAVLNode_ *)0x0) {
    root = &(pPVar3->base).left + ((PTreeAVLNode_ *)(pPVar3->base).left != pPVar4);
  }
  *root = &node->base;
  iVar1 = node->balance_factor;
  node->balance_factor = iVar1 + -1;
  *(int *)&(node->base).right[1].right = 1 - iVar1;
  return;
}

Assistant:

static void
pp_tree_avl_rotate_right (PTreeAVLNode *node, PTreeBaseNode **root)
{
	node->parent->base.left = node->base.right;

	if (node->base.right != NULL)
		((PTreeAVLNode *) node->base.right)->parent = (PTreeAVLNode *) node->parent;

	node->base.right = (PTreeBaseNode *) node->parent;
	node->parent = ((PTreeAVLNode *) node->base.right)->parent;
	((PTreeAVLNode *) node->base.right)->parent = node;

	if (P_LIKELY (node->parent != NULL)) {
		if (node->parent->base.left == node->base.right)
			node->parent->base.left = (PTreeBaseNode *) node;
		else
			node->parent->base.right = (PTreeBaseNode *) node;
	} else
		*root = (PTreeBaseNode *) node;

	/* Restore balance factor */
	((PTreeAVLNode *) node)->balance_factor -= 1;
	((PTreeAVLNode *) node->base.right)->balance_factor = -((PTreeAVLNode *) node)->balance_factor;
}